

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fifo_cache.hpp
# Opt level: O0

optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *
__thiscall
cappuccino::
fifo_cache<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(cappuccino::thread_safe)1>
::find(optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
       *__return_storage_ptr__,
      fifo_cache<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(cappuccino::thread_safe)1>
      *this,unsigned_long *key)

{
  lock_guard<cappuccino::mutex<(cappuccino::thread_safe)1,_std::mutex>_> local_28;
  lock_guard<cappuccino::mutex<(cappuccino::thread_safe)1,_std::mutex>_> guard;
  unsigned_long *key_local;
  fifo_cache<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(cappuccino::thread_safe)1>
  *this_local;
  
  guard._M_device = (mutex_type *)key;
  std::lock_guard<cappuccino::mutex<(cappuccino::thread_safe)1,_std::mutex>_>::lock_guard
            (&local_28,&this->m_lock);
  do_find(__return_storage_ptr__,this,(unsigned_long *)guard._M_device);
  std::lock_guard<cappuccino::mutex<(cappuccino::thread_safe)1,_std::mutex>_>::~lock_guard
            (&local_28);
  return __return_storage_ptr__;
}

Assistant:

auto find(const key_type& key) -> std::optional<value_type>
    {
        std::lock_guard guard{m_lock};
        return do_find(key);
    }